

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O3

void __thiscall DbCheckPostLower::EnsureValidEndBoundary(DbCheckPostLower *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  IRKind IVar3;
  bool bVar4;
  LabelInstr *pLVar5;
  undefined4 *puVar6;
  
  IVar3 = instr->m_kind;
  if ((IVar3 != InstrKindLabel) && (IVar3 != InstrKindProfiledLabel)) {
    OVar1 = instr->m_opcode;
    if ((OVar1 != CMP) && ((OVar1 != JMP && (OVar1 != TEST)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x12e,"(IsEndBoundary(instr))",
                         "Nested helper call. Not a valid end boundary.");
      if (!bVar4) goto LAB_00402fe9;
      *puVar6 = 0;
      IVar3 = instr->m_kind;
    }
  }
  if ((IVar3 == InstrKindProfiledLabel) || (IVar3 == InstrKindLabel)) {
    pLVar5 = IR::Instr::GetNextNonEmptyLabel(instr);
    if ((pLVar5->field_0x78 & 2) != 0) {
      IR::Instr::Dump(instr);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x132,"(false)","Nested helper call. Falling through a helper label.");
      if (!bVar4) goto LAB_00402fe9;
      *puVar6 = 0;
    }
  }
  if (instr->m_opcode == JMP) {
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar4) goto LAB_00402fe9;
      *puVar6 = 0;
    }
    pLVar5 = IR::Instr::GetNextNonEmptyLabel(instr[1].m_next);
    if ((pLVar5->field_0x78 & 2) != 0) {
      IR::Instr::Dump(instr);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x138,"(false)","Nested helper call. Jumping to a helper label.");
      if (!bVar4) {
LAB_00402fe9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  return;
}

Assistant:

void
DbCheckPostLower::EnsureValidEndBoundary(IR::Instr *instr)
{
    AssertMsg(IsEndBoundary(instr), "Nested helper call. Not a valid end boundary.");
    if (instr->IsLabelInstr() && instr->AsLabelInstr()->GetNextNonEmptyLabel()->isOpHelper)
    {
        instr->Dump();
        AssertMsg(false, "Nested helper call. Falling through a helper label.");
    }

    if (instr->m_opcode == Js::OpCode::JMP && instr->AsBranchInstr()->GetTarget()->GetNextNonEmptyLabel()->isOpHelper)
    {
        instr->Dump();
        AssertMsg(false, "Nested helper call. Jumping to a helper label.");
    }
}